

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O0

void __thiscall Fl_Help_Dialog::cb_view__i(Fl_Help_Dialog *this,Fl_Help_View *param_1,void *param_2)

{
  Fl_Window *this_00;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  void *param_2_local;
  Fl_Help_View *param_1_local;
  Fl_Help_Dialog *this_local;
  
  pcVar3 = Fl_Help_View::filename(this->view_);
  if (pcVar3 == (char *)0x0) {
    this->index_ = 0;
    this->file_[this->index_][0] = '\0';
    iVar2 = Fl_Help_View::topline(this->view_);
    this->line_[this->index_] = iVar2;
    Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
    Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
  }
  else {
    uVar1 = Fl_Widget::changed((Fl_Widget *)this->view_);
    if (uVar1 == 0) {
      iVar2 = this->index_;
      pcVar3 = Fl_Help_View::filename(this->view_);
      fl_strlcpy(this->file_[iVar2],pcVar3,0x800);
      iVar2 = Fl_Help_View::topline(this->view_);
      this->line_[this->index_] = iVar2;
    }
    else {
      this->index_ = this->index_ + 1;
      if (99 < this->index_) {
        memmove(this->line_,this->line_ + 10,0x168);
        memmove(this->file_,this->file_ + 10,0x2d000);
        this->index_ = this->index_ + -10;
      }
      this->max_ = this->index_;
      iVar2 = this->index_;
      pcVar3 = Fl_Help_View::filename(this->view_);
      fl_strlcpy(this->file_[iVar2],pcVar3,0x800);
      iVar2 = Fl_Help_View::topline(this->view_);
      this->line_[this->index_] = iVar2;
      if (this->index_ < 1) {
        Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
      }
      else {
        Fl_Widget::activate(&this->back_->super_Fl_Widget);
      }
      Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
      this_00 = &this->window_->super_Fl_Window;
      pcVar3 = Fl_Help_View::title(this->view_);
      Fl_Window::label(this_00,pcVar3);
    }
  }
  return;
}

Assistant:

void Fl_Help_Dialog::cb_view__i(Fl_Help_View*, void*) {
  if (view_->filename())
{
  if (view_->changed())
  {
    index_ ++;

    if (index_ >= 100)
    {
      memmove(line_, line_ + 10, sizeof(line_[0]) * 90);
      memmove(file_, file_ + 10, sizeof(file_[0]) * 90);
      index_ -= 10;
    }

    max_ = index_;

    strlcpy(file_[index_], view_->filename(),sizeof(file_[0]));
    line_[index_] = view_->topline();

    if (index_ > 0)
      back_->activate();
    else
      back_->deactivate();

    forward_->deactivate();
    window_->label(view_->title());
  }
  else // if ! view_->changed()
  {
    strlcpy(file_[index_], view_->filename(), sizeof(file_[0]));
    line_[index_] = view_->topline();
  }
} else { // if ! view_->filename()
  index_ = 0; // hitting an internal page will disable the back/fwd buffer
  file_[index_][0] = 0; // unnamed internal page
  line_[index_] = view_->topline();
  back_->deactivate();
  forward_->deactivate();
};
}